

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManPropagate(Gia_Man_t *p)

{
  int v;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  iVar5 = 1;
  while ((iVar5 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar5), pGVar1 != (Gia_Obj_t *)0x0))) {
    uVar3 = *(ulong *)pGVar1;
    uVar7 = (uint)uVar3;
    uVar4 = uVar3 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || (int)uVar7 < 0) {
      if ((int)uVar7 < 0 && (int)uVar4 != 0x1fffffff) {
        pGVar1->Value = pGVar1->Value + (((uVar7 >> 0x1d & 1) != 0) + 0x31) * pGVar1[-uVar4].Value;
      }
    }
    else {
      uVar6 = (uint)(uVar3 >> 0x1d) & 1;
      uVar7 = (uint)(uVar3 >> 0x20);
      uVar8 = uVar7 >> 0x1d & 1;
      uVar3 = (ulong)(uVar7 & 0x1fffffff);
      uVar7 = (uVar8 + 0x31) * pGVar1[-uVar3].Value + (uVar6 + 0x31) * pGVar1[-uVar4].Value +
              pGVar1->Value;
      pGVar1->Value = uVar7;
      if ((uVar6 == uVar8) && (pGVar1[-uVar4].Value == pGVar1[-uVar3].Value)) {
        pGVar1->Value = uVar7 + 0xdebbdff0;
      }
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while( true ) {
    if (p->nRegs <= iVar5) {
      return;
    }
    pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar5);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    v = Vec_IntEntry(p->vCis,(p->vCis->nSize - p->nRegs) + iVar5);
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return;
    }
    uVar7 = pGVar2->Value + pGVar1->Value;
    pGVar2->Value = uVar7;
    if (pGVar2 == pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) {
      pGVar2->Value = uVar7 + 0x63ba1fa2;
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void Gia_Iso2ManPropagate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i;
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value + (Gia_ObjFaninC1(pObj) + s_PrimeC) * Gia_ObjFanin1(pObj)->Value;
            if ( Gia_ObjFaninC0(pObj) == Gia_ObjFaninC1(pObj) && Gia_ObjFanin0(pObj)->Value == Gia_ObjFanin1(pObj)->Value )
                pObj->Value += s_256Primes[ISO_MASK - 11];
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value;
    Gia_ManForEachRiRo( p, pObj, pObjRo, i )
    {
        pObjRo->Value += pObj->Value;
        if ( pObjRo == Gia_ObjFanin0(pObj) )
            pObjRo->Value += s_256Primes[ISO_MASK - 12];
    }
}